

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O2

TestPartResult * __thiscall
testing::TestPartResultArray::GetTestPartResult(TestPartResultArray *this,int index)

{
  if (-1 < index) {
    if (index < (int)((*(long *)(this + 8) - *(long *)this) / 0x70)) {
      return (TestPartResult *)(*(long *)this + (ulong)(uint)index * 0x70);
    }
  }
  printf("\nInvalid index (%d) into TestPartResultArray.\n");
  internal::posix::Abort();
}

Assistant:

const TestPartResult& TestPartResultArray::GetTestPartResult(int index) const {
  if (index < 0 || index >= size()) {
    printf("\nInvalid index (%d) into TestPartResultArray.\n", index);
    internal::posix::Abort();
  }

  return array_[static_cast<size_t>(index)];
}